

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall embree::Application::Application(Application *this,int features)

{
  runtime_error *this_00;
  uint in_ESI;
  undefined8 *in_RDI;
  double dVar1;
  undefined4 in_stack_fffffffffffffb38;
  Verbosity in_stack_fffffffffffffb3c;
  Application *in_stack_fffffffffffffb40;
  allocator *f;
  string *in_stack_fffffffffffffb48;
  string *name;
  Application *in_stack_fffffffffffffb50;
  Application *this_01;
  allocator local_3d1;
  string local_3d0 [47];
  undefined1 local_3a1 [40];
  undefined1 local_379 [48];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [47];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [47];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [47];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [47];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [47];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [47];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [47];
  allocator local_41;
  string local_40 [51];
  allocator local_d;
  uint local_c;
  
  *in_RDI = &PTR__Application_00605738;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 1),"",&local_d);
  std::allocator<char>::~allocator((allocator<char> *)&local_d);
  *(undefined4 *)(in_RDI + 5) = 0;
  *(uint *)((long)in_RDI + 0x2c) = local_c;
  CommandLineParser::CommandLineParser
            ((CommandLineParser *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c);
  *(undefined1 *)(in_RDI + 0x10) = 0;
  dVar1 = getSeconds();
  in_RDI[0x11] = dVar1;
  in_RDI[0x12] = in_RDI[0x11];
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  if (instance != (undefined8 *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"internal error: application already created");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  instance = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"help",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_70,"--help: prints help for all supported command line options",&local_71);
  registerOption<embree::Application::registerOption(int)::__0>
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
             (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
             (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((local_c & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"rtcore",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c8,"--rtcore <string>: uses <string> to configure Embree device",&local_c9);
    registerOption<embree::Application::registerOption(int)::__1>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"threads",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"--threads <int>: number of threads to use",&local_121);
    registerOption<embree::Application::registerOption(int)::__2>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"affinity",&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"--affinity: affinitize threads",&local_179);
    registerOption<embree::Application::registerOption(int)::__3>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"set_affinity",&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1d0,"--set_affinity <0/1>: enables or disables affinitizing of threads",
               &local_1d1);
    registerOption<embree::Application::registerOption(int)::__4>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"set_affinity",&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"set-affinity",&local_221);
    registerOptionAlias(in_stack_fffffffffffffb40,
                        (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                        (string *)0x1840b8);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"start_threads",&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_278,"--start_threads <0/1>: starts threads at device creation time if set to 1"
               ,&local_279);
    registerOption<embree::Application::registerOption(int)::__5>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a0,"start_threads",&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c8,"start-threads",&local_2c9);
    registerOptionAlias(in_stack_fffffffffffffb40,
                        (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                        (string *)0x18422a);
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::__cxx11::string::~string(local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2f0,"verbose",&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"--verbose <int>: sets verbosity level",&local_321);
    registerOption<embree::Application::registerOption(int)::__6>
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_348,"delta",&local_349);
    this_01 = (Application *)local_379;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_379 + 1),"--delta: print delta numbers in log",(allocator *)this_01)
    ;
    registerOption<embree::Application::registerOption(int)::__7>
              (this_01,in_stack_fffffffffffffb48,
               (anon_class_8_1_8991fb9c_for_f *)in_stack_fffffffffffffb40,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string((string *)(local_379 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_379);
    std::__cxx11::string::~string(local_348);
    std::allocator<char>::~allocator((allocator<char> *)&local_349);
    name = (string *)local_3a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_3a1 + 1),"isa",(allocator *)name);
    f = &local_3d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3d0,
               "--isa <string>: selects instruction set to use:\n  sse: select SSE codepath\n  sse2: select SSE2 codepath\n  sse3: select SSE3 codepath\n  ssse3: select SSSE3 codepath\n  sse4.1: select SSE4.1 codepath\n  sse4.2: select SSE4.2 codepath\n  avx: select AVX codepath\n  avxi: select AVXI codepath\n  avx2: select AVX2 codepath\n  avx512: select AVX512 codepath\n"
               ,f);
    registerOption<embree::Application::registerOption(int)::__8>
              (this_01,name,(anon_class_8_1_8991fb9c_for_f *)f,
               (string *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38));
    std::__cxx11::string::~string(local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    std::__cxx11::string::~string((string *)(local_3a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3a1);
  }
  return;
}

Assistant:

Application::Application(int features)
    : rtcore(""), verbosity(0),
      features((Features)features),
      log_delta(false),
      start_time(getSeconds()),
      last_time(start_time),
      last_virtual_memory(0),
      last_resident_memory(0)
  {
    if (instance)
      throw std::runtime_error("internal error: application already created");

    instance = this;

    registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");

    if (features & FEATURE_RTCORE)
    {
      registerOption("rtcore", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += "," + cin->getString();
        }, "--rtcore <string>: uses <string> to configure Embree device");
    
      registerOption("threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",threads=" + toString(cin->getInt());
        }, "--threads <int>: number of threads to use");

      registerOption("affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=1";
        }, "--affinity: affinitize threads");

      registerOption("set_affinity", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",set_affinity=" + cin->getString();
        }, "--set_affinity <0/1>: enables or disables affinitizing of threads");
      registerOptionAlias("set_affinity","set-affinity");

      registerOption("start_threads", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",start_threads=" + cin->getString();
        }, "--start_threads <0/1>: starts threads at device creation time if set to 1");
      registerOptionAlias("start_threads","start-threads");
      
      registerOption("verbose", [this] (Ref<ParseStream> cin, const FileName& path) {
          verbosity = cin->getInt();
          rtcore += ",verbose=" + toString(verbosity);
        }, "--verbose <int>: sets verbosity level");

      registerOption("delta", [this] (Ref<ParseStream> cin, const FileName& path) {
          log_delta = true;
        }, "--delta: print delta numbers in log");
      
      registerOption("isa", [this] (Ref<ParseStream> cin, const FileName& path) {
          rtcore += ",isa=" + cin->getString();
        }, "--isa <string>: selects instruction set to use:\n"
        "  sse: select SSE codepath\n"
        "  sse2: select SSE2 codepath\n"
        "  sse3: select SSE3 codepath\n"
        "  ssse3: select SSSE3 codepath\n"
        "  sse4.1: select SSE4.1 codepath\n"
        "  sse4.2: select SSE4.2 codepath\n"
        "  avx: select AVX codepath\n"
        "  avxi: select AVXI codepath\n"
        "  avx2: select AVX2 codepath\n"
        "  avx512: select AVX512 codepath\n");
    } 
  }